

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O0

Var Js::JavascriptDate::EntryValueOf(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptDate *pJVar7;
  double value_00;
  double value;
  JavascriptDate *date;
  Var result;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x614,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  result = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x617,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar2 = VarIs<Js::JavascriptDate>(pvVar6);
    if (bVar2) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pJVar7 = VarTo<Js::JavascriptDate>(pvVar6);
      if (((ulong)scriptContext & 0xffffff) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                    ,0x624,"(args.Info.Count > 0)","Negative argument count");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      value_00 = DateImplementation::GetMilliSeconds(&pJVar7->m_date);
      pvVar6 = JavascriptNumber::ToVarNoCheck(value_00,(ScriptContext *)result);
      return pvVar6;
    }
  }
  date = (JavascriptDate *)0x0;
  BVar3 = TryInvokeRemotely(EntryValueOf,(ScriptContext *)result,(Arguments *)&scriptContext,&date);
  if (BVar3 != 0) {
    return date;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)result,-0x7ff5ec3d,L"Date.prototype.valueOf");
}

Assistant:

Var JavascriptDate::EntryValueOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryValueOf, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.valueOf"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        AssertMsg(args.Info.Count > 0, "Negative argument count");
        double value = date->m_date.GetMilliSeconds();
        return JavascriptNumber::ToVarNoCheck(value, scriptContext);
    }